

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.h
# Opt level: O2

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::~CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this)

{
  IArgFunction<Catch::ConfigData> *pIVar1;
  
  std::__cxx11::string::~string((string *)&this->placeholder);
  std::__cxx11::string::~string((string *)&this->detail);
  std::__cxx11::string::~string((string *)&this->description);
  pIVar1 = (this->boundField).functionObj;
  if (pIVar1 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar1->_vptr_IArgFunction[1])();
    return;
  }
  return;
}

Assistant:

CommonArgProperties( Detail::BoundArgFunction<ConfigT> const& _boundField ) : boundField( _boundField ) {}